

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O3

float Cgt_ManComputeCoverage(Aig_Man_t *pAig,Vec_Vec_t *vGates)

{
  int iVar1;
  Ssw_Sml_t *p;
  long lVar2;
  int iVar3;
  float local_24;
  
  iVar3 = 0;
  p = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  if (vGates->nSize < 1) {
    local_24 = 0.0;
  }
  else {
    lVar2 = 0;
    do {
      iVar1 = Ssw_SmlNodeCountOnesRealVec(p,(Vec_Ptr_t *)vGates->pArray[lVar2]);
      iVar3 = iVar3 + iVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vGates->nSize);
    local_24 = (float)iVar3 * 100.0 * 0.03125 * 0.03125;
  }
  Ssw_SmlStop(p);
  return local_24 / (float)vGates->nSize;
}

Assistant:

float Cgt_ManComputeCoverage( Aig_Man_t * pAig, Vec_Vec_t * vGates )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vOne;
    int i, nTransSaved = 0;
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Vec_VecForEachLevel( vGates, vOne, i )
        nTransSaved += Ssw_SmlNodeCountOnesRealVec( pSml, vOne );
    Ssw_SmlStop( pSml );
    return (float)100.0*nTransSaved/32/nFrames/nWords/Vec_VecSize(vGates);
}